

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O0

DdManager * Aig_ManBuildPoBdd(Aig_Man_t *p,DdNode **pbFunc)

{
  int iVar1;
  uint numVars;
  DdManager *unique;
  Aig_Obj_t *pAVar2;
  DdNode *pDVar3;
  void *pvVar4;
  Aig_Obj_t *pObj_00;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  DdManager *dd;
  DdNode **pbFunc_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManPoNum(p);
  if (iVar1 == 1) {
    Aig_ManCleanData(p);
    numVars = Aig_ManCiNum(p);
    unique = Cudd_Init(numVars,0,0x100,0x40000,0);
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    pAVar2 = Aig_ManConst1(p);
    pDVar3 = Cudd_ReadOne(unique);
    (pAVar2->field_5).pData = pDVar3;
    Cudd_Ref((DdNode *)(pAVar2->field_5).pData);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar4 = Vec_PtrEntry(p->vCis,local_2c);
      pDVar3 = Cudd_bddIthVar(unique,local_2c);
      *(DdNode **)((long)pvVar4 + 0x28) = pDVar3;
      Cudd_Ref(*(DdNode **)((long)pvVar4 + 0x28));
    }
    pAVar2 = Aig_ManCo(p,0);
    pObj_00 = Aig_ObjFanin0(pAVar2);
    pDVar3 = Aig_ManBuildPoBdd_rec(p,pObj_00,unique);
    *pbFunc = pDVar3;
    Cudd_Ref(*pbFunc);
    pDVar3 = *pbFunc;
    iVar1 = Aig_ObjFaninC0(pAVar2);
    *pbFunc = (DdNode *)((ulong)pDVar3 ^ (long)iVar1);
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar4 = Vec_PtrEntry(p->vObjs,local_2c);
      if ((pvVar4 != (void *)0x0) && (*(long *)((long)pvVar4 + 0x28) != 0)) {
        Cudd_RecursiveDeref(unique,*(DdNode **)((long)pvVar4 + 0x28));
      }
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
    return unique;
  }
  __assert_fail("Saig_ManPoNum(p) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                ,200,"DdManager *Aig_ManBuildPoBdd(Aig_Man_t *, DdNode **)");
}

Assistant:

DdManager * Aig_ManBuildPoBdd( Aig_Man_t * p, DdNode ** pbFunc )
{
    DdManager * dd;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManCleanData( p );
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    pObj = Aig_ManCo( p, 0 );
    *pbFunc = Aig_ManBuildPoBdd_rec( p, Aig_ObjFanin0(pObj), dd );  Cudd_Ref( *pbFunc );
    *pbFunc = Cudd_NotCond( *pbFunc, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Cudd_ReduceHeap( dd,  CUDD_REORDER_SYMM_SIFT, 1 );
    return dd;
}